

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O1

bool __thiscall QMimeGlobPattern::matchFileName(QMimeGlobPattern *this,QString *inputFileName)

{
  char16_t cVar1;
  totally_ordered_wrapper<QRegularExpressionPrivate_*> tVar2;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> originalLength;
  bool bVar3;
  Category CVar4;
  CutResult CVar5;
  QRegularExpressionPrivate *pQVar6;
  totally_ordered_wrapper<QRegularExpressionPrivate_*> tVar7;
  char16_t *pcVar8;
  storage_type_conflict *psVar9;
  char16_t *pcVar10;
  QRegularExpressionMatch QVar11;
  char *pcVar12;
  char32_t ucs4;
  long lVar13;
  qsizetype qVar14;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView lhs;
  QStringView pattern;
  QLatin1StringView lhs_00;
  QRegularExpression rx;
  undefined1 local_58 [24];
  char16_t *pcStack_40;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate> local_38;
  QRegularExpressionMatch local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (this->m_caseSensitivity == CaseInsensitive) {
    QString::toLower_helper((QString *)(local_58 + 0x10),inputFileName);
  }
  else {
    local_58._16_8_ = (inputFileName->d).d;
    pcStack_40 = (inputFileName->d).ptr;
    local_38.d.ptr = (totally_ordered_wrapper<QRegularExpressionPrivate_*>)(inputFileName->d).size;
    if ((QArrayData *)local_58._16_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((QArrayData *)local_58._16_8_)->ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((QArrayData *)local_58._16_8_)->ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  originalLength.d.ptr = local_38.d.ptr;
  pcVar8 = pcStack_40;
  tVar2.ptr = (QRegularExpressionPrivate *)(this->m_pattern).d.size;
  if (tVar2.ptr != (QRegularExpressionPrivate *)0x0) {
    switch(this->m_patternType) {
    case SuffixPattern:
      if (tVar2.ptr <= (QRegularExpressionPrivate *)((long)local_38.d.ptr + 1)) {
        tVar7.ptr = (QRegularExpressionPrivate *)0x1;
        if (tVar2.ptr != (QRegularExpressionPrivate *)0x1) {
          if (pcStack_40 == (char16_t *)0x0) {
            pcVar8 = L"";
          }
          pcVar10 = (this->m_pattern).d.ptr;
          if (pcVar10 == (char16_t *)0x0) {
            pcVar10 = L"";
          }
          pQVar6 = (QRegularExpressionPrivate *)0x1;
          lVar13 = -2;
          do {
            tVar7.ptr = pQVar6;
            if (*(short *)((long)pcVar10 + lVar13 + (long)tVar2.ptr * 2) !=
                *(short *)((long)pcVar8 + lVar13 + (long)local_38.d.ptr * 2)) break;
            pQVar6 = (QRegularExpressionPrivate *)
                     ((long)&(((QArrayData *)&pQVar6->super_QSharedData)->ref_)._q_value.
                             super___atomic_base<int>._M_i + 1);
            lVar13 = lVar13 + -2;
            tVar7.ptr = tVar2.ptr;
          } while (tVar2.ptr != pQVar6);
        }
LAB_004b4b21:
        bVar3 = tVar2.ptr == tVar7.ptr;
        goto LAB_004b4a48;
      }
      break;
    case PrefixPattern:
      if (tVar2.ptr <= (QRegularExpressionPrivate *)((long)local_38.d.ptr + 1)) {
        tVar7.ptr = (QRegularExpressionPrivate *)0x1;
        if (tVar2.ptr != (QRegularExpressionPrivate *)0x1) {
          if (pcStack_40 == (char16_t *)0x0) {
            pcVar8 = L"";
          }
          pcVar10 = (this->m_pattern).d.ptr;
          if (pcVar10 == (char16_t *)0x0) {
            pcVar10 = L"";
          }
          pQVar6 = (QRegularExpressionPrivate *)0x1;
          do {
            tVar7.ptr = pQVar6;
            if (pcVar10[(long)&pQVar6[-1].field_0x47] != pcVar8[(long)&pQVar6[-1].field_0x47])
            break;
            pQVar6 = (QRegularExpressionPrivate *)
                     ((long)&(((QArrayData *)&pQVar6->super_QSharedData)->ref_)._q_value.
                             super___atomic_base<int>._M_i + 1);
            tVar7.ptr = tVar2.ptr;
          } while (tVar2.ptr != pQVar6);
        }
        goto LAB_004b4b21;
      }
      break;
    case LiteralPattern:
      if ((totally_ordered_wrapper<QRegularExpressionPrivate_*>)tVar2.ptr == local_38.d.ptr) {
        rhs_00.m_data = pcStack_40;
        rhs_00.m_size = (qsizetype)local_38.d.ptr;
        lhs.m_data = (this->m_pattern).d.ptr;
        lhs.m_size = (qsizetype)tVar2.ptr;
        bVar3 = QtPrivate::equalStrings(lhs,rhs_00);
        goto LAB_004b4a48;
      }
      break;
    case VdrPattern:
      if ((((local_38.d.ptr == (QRegularExpressionPrivate *)&DAT_00000007) &&
           ((cVar1 = *pcStack_40, (ushort)cVar1 - 0x30 < 10 ||
            ((0x7f < (ushort)cVar1 &&
             (CVar4 = QChar::category((uint)(ushort)cVar1), CVar4 == Number_DecimalDigit)))))) &&
          ((cVar1 = pcVar8[1], (ushort)cVar1 - 0x30 < 10 ||
           ((0x7f < (ushort)cVar1 &&
            (CVar4 = QChar::category((uint)(ushort)cVar1), CVar4 == Number_DecimalDigit)))))) &&
         ((cVar1 = pcVar8[2], (ushort)cVar1 - 0x30 < 10 ||
          ((0x7f < (ushort)cVar1 &&
           (CVar4 = QChar::category((uint)(ushort)cVar1), CVar4 == Number_DecimalDigit)))))) {
        local_58._0_8_ = originalLength.d.ptr;
        local_58._8_8_ = pcVar8;
        rhs = QStringView::mid((QStringView *)local_58,3,4);
        if (rhs.m_size == 4) {
          pcVar12 = ".vdr";
          qVar14 = 4;
LAB_004b4bde:
          lhs_00.m_data = pcVar12;
          lhs_00.m_size = qVar14;
          bVar3 = QtPrivate::equalStrings(lhs_00,rhs);
          goto LAB_004b4a48;
        }
      }
      break;
    case AnimPattern:
      if ((QRegularExpressionPrivate *)0x5 < (ulong)local_38.d.ptr) {
        ucs4 = (char32_t)(ushort)pcStack_40[(long)((long)local_38.d.ptr + -1)];
        if ((ushort)pcStack_40[(long)((long)local_38.d.ptr + -1)] - 0x30 < 10) {
          if (ucs4 != L'0') goto LAB_004b4b8b;
        }
        else if ((uint)ucs4 < 0x80) {
          if (ucs4 == L'j') goto LAB_004b4b8b;
        }
        else {
          CVar4 = QChar::category(ucs4);
          if (CVar4 == Number_DecimalDigit) {
LAB_004b4b8b:
            local_58._0_8_ = (long)originalLength.d.ptr + -6;
            local_28.d.d.ptr =
                 (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                 (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x5;
            CVar5 = QtPrivate::QContainerImplHelper::mid
                              ((qsizetype)originalLength.d.ptr,(qsizetype *)local_58,
                               (qsizetype *)&local_28);
            bVar3 = false;
            QVar11.d.d.ptr = local_28.d.d.ptr;
            if (CVar5 == Null) {
              QVar11.d.d.ptr =
                   (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                   (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
                   (QRegularExpressionMatchPrivate *)0x0;
            }
            if (QVar11.d.d.ptr != (totally_ordered_wrapper<QRegularExpressionMatchPrivate_*>)0x5)
            goto LAB_004b4a48;
            psVar9 = (storage_type_conflict *)0x0;
            if (CVar5 != Null) {
              psVar9 = pcVar8 + local_58._0_8_;
            }
            rhs.m_data = psVar9;
            rhs.m_size = 5;
            pcVar12 = ".anim";
            qVar14 = 5;
            goto LAB_004b4bde;
          }
        }
      }
      break;
    case OtherPattern:
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pattern.m_data = (storage_type_conflict *)tVar2.ptr;
      pattern.m_size = (qsizetype)local_58;
      QRegularExpression::fromWildcard
                (pattern,(CaseSensitivity)(this->m_pattern).d.ptr,(WildcardConversionOptions)0x0);
      QRegularExpression::match
                ((QRegularExpression *)&local_28,(QString *)local_58,(qsizetype)(local_58 + 0x10),
                 NormalMatch,(MatchOptions)0x0);
      bVar3 = QRegularExpressionMatch::hasMatch(&local_28);
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_28);
      QRegularExpression::~QRegularExpression((QRegularExpression *)local_58);
      goto LAB_004b4a48;
    }
  }
  bVar3 = false;
LAB_004b4a48:
  if ((QArrayData *)local_58._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._16_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QMimeGlobPattern::matchFileName(const QString &inputFileName) const
{
    // "Applications MUST match globs case-insensitively, except when the case-sensitive
    // attribute is set to true."
    // The constructor takes care of putting case-insensitive patterns in lowercase.
    const QString fileName = m_caseSensitivity == Qt::CaseInsensitive
            ? inputFileName.toLower() : inputFileName;

    const qsizetype patternLength = m_pattern.size();
    if (!patternLength)
        return false;
    const qsizetype fileNameLength = fileName.size();

    switch (m_patternType) {
    case SuffixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode() + patternLength - 1;
        const QChar *c2 = fileName.unicode() + fileNameLength - 1;
        int cnt = 1;
        while (cnt < patternLength && *c1-- == *c2--)
            ++cnt;
        return cnt == patternLength;
    }
    case PrefixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode();
        const QChar *c2 = fileName.unicode();
        int cnt = 1;
        while (cnt < patternLength && *c1++ == *c2++)
           ++cnt;
        return cnt == patternLength;
    }
    case LiteralPattern:
        return (m_pattern == fileName);
    case VdrPattern: // "[0-9][0-9][0-9].vdr" case
        return fileNameLength == 7
                && fileName.at(0).isDigit() && fileName.at(1).isDigit() && fileName.at(2).isDigit()
                && QStringView{fileName}.mid(3, 4) == ".vdr"_L1;
    case AnimPattern: { // "*.anim[1-9j]" case
        if (fileNameLength < 6)
            return false;
        const QChar lastChar = fileName.at(fileNameLength - 1);
        const bool lastCharOK = (lastChar.isDigit() && lastChar != u'0')
                              || lastChar == u'j';
        return lastCharOK && QStringView{fileName}.mid(fileNameLength - 6, 5) == ".anim"_L1;
    }
    case OtherPattern:
        // Other fallback patterns: slow but correct method
#if QT_CONFIG(regularexpression)
        auto rx = QRegularExpression::fromWildcard(m_pattern);
        return rx.match(fileName).hasMatch();
#else
        return false;
#endif
    }
    return false;
}